

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Attribute::~Attribute(Attribute *this)

{
  Attribute *this_local;
  
  AttrMetas::~AttrMetas(&this->_metas);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  primvar::PrimVar::~PrimVar(&this->_var);
  std::__cxx11::string::~string((string *)&this->_type_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Attribute() = default;